

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfmArea.c
# Opt level: O1

int Abc_NtkPrecomputePrint(Mio_Cell2_t *pCells,int nCells,Vec_Int_t *vInfo)

{
  Mio_Cell2_t *pMVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  int *piVar5;
  uint nVarsInit;
  int iVar6;
  int iVar7;
  ulong uVar8;
  int iVar9;
  ulong uVar10;
  ulong uVar11;
  uint uVar12;
  ulong uVar13;
  int local_40;
  
  iVar7 = 0;
  if (2 < nCells) {
    uVar8 = 2;
    iVar7 = 0;
    uVar10 = 0;
    do {
      pMVar1 = pCells + uVar8;
      uVar2 = *(uint *)&pMVar1->field_0x10;
      nVarsInit = uVar2 >> 0x1c;
      printf("%3d : %8s   Fanins = %d   ",uVar8,pMVar1->pName,(ulong)nVarsInit);
      Dau_DsdPrintFromTruth(&pMVar1->uTruth,nVarsInit);
      uVar11 = uVar10 & 0xffffffff;
      uVar13 = 0;
      do {
        local_40 = (int)uVar10;
        if ((((local_40 < 0) || (iVar3 = vInfo->nSize, iVar9 = (int)uVar11, iVar3 <= iVar9)) ||
            (iVar3 <= iVar9 + 1)) || (iVar3 <= iVar9 + 2)) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                        ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        piVar5 = vInfo->pArray;
        iVar3 = piVar5[uVar11];
        uVar12 = (uint)uVar13;
        if (iVar3 != -1) {
          iVar9 = piVar5[uVar11 + 1];
          iVar4 = piVar5[uVar11 + 2];
          printf("%d : {",uVar13);
          if (0xfffffff < uVar2) {
            iVar6 = 0;
            do {
              printf(" %d ",(ulong)(iVar9 >> ((byte)iVar6 & 0x1f) & 0xf));
              iVar6 = iVar6 + 4;
            } while (nVarsInit * 4 != iVar6);
          }
          printf("}  Index = %d  ",uVar11 & 0xffffffff);
          printf("Gain = %6.2f  ",(double)((float)iVar4 / 1000.0));
          Dau_DsdPrintFromTruth(&pCells[iVar3].uTruth,*(uint *)&pCells[iVar3].field_0x10 >> 0x1c);
          iVar7 = iVar7 + 1;
        }
        uVar11 = uVar11 + 3;
        uVar13 = (ulong)(uVar12 + 1);
      } while (uVar12 != nVarsInit);
      uVar8 = uVar8 + 1;
      uVar10 = uVar11;
    } while (uVar8 != (uint)nCells);
  }
  return iVar7;
}

Assistant:

int Abc_NtkPrecomputePrint( Mio_Cell2_t * pCells, int nCells, Vec_Int_t * vInfo )
{
    int i, n, v, Index = 0, nRecUsed = 0;
    for ( i = 2; i < nCells; i++ )
    {
        int nFanins = pCells[i].nFanins;
        printf( "%3d : %8s   Fanins = %d   ", i, pCells[i].pName, nFanins );
        Dau_DsdPrintFromTruth( &pCells[i].uTruth, nFanins );
        for ( n = 0; n <= nFanins; n++, Index += 3 )
        {
            int iCellA = Vec_IntEntry( vInfo, Index+0 );
            int iPerm  = Vec_IntEntry( vInfo, Index+1 );
            int Diff   = Vec_IntEntry( vInfo, Index+2 );
            if ( iCellA == -1 )
                continue;
            printf( "%d : {", n );
            for ( v = 0; v < nFanins; v++ )
                printf( " %d ", (iPerm >> (v << 2)) & 15 );
            printf( "}  Index = %d  ", Index );

            printf( "Gain = %6.2f  ", Scl_Int2Flt(Diff) );
            Dau_DsdPrintFromTruth( &pCells[iCellA].uTruth, pCells[iCellA].nFanins );
            nRecUsed++;
        }
    }
    return nRecUsed;
}